

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O0

any * shadow::pointer_detail::generic_dereference_bind_point<b>
                (any *__return_storage_ptr__,any *value)

{
  decay_t<b_*> *ppbVar1;
  any *value_local;
  
  ppbVar1 = any::get<b*>(value);
  any::any<b&,void,void>(__return_storage_ptr__,*ppbVar1);
  return __return_storage_ptr__;
}

Assistant:

inline any
generic_dereference_bind_point(any& value)
{
    return any(*(value.get<T*>()));
}